

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

Pseudo * allocate_symbol_pseudo(Proc *proc,LuaSymbol *sym,uint reg)

{
  Scope *pSVar1;
  uint in_ECX;
  undefined4 in_register_00000014;
  Proc *pPVar2;
  
  pPVar2 = (Proc *)CONCAT44(in_register_00000014,reg);
  pSVar1 = (Scope *)(*(code *)sym)(proc,1,0x30);
  ((anon_union_40_9_1ec7a544_for_Pseudo_3 *)&pSVar1->parent)->proc = pPVar2;
  *(uint *)&pSVar1->function = *(uint *)&pSVar1->function & 0xfff00000 | (in_ECX & 0xffff) << 4;
  if (pPVar2->node_count == 0) {
    if (pPVar2->current_scope != (Scope *)0x0) {
      __assert_fail("sym->variable.pseudo == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi-compiler/src/linearizer.c"
                    ,0x1c8,"Pseudo *allocate_symbol_pseudo(Proc *, LuaSymbol *, unsigned int)");
    }
    pPVar2->current_scope = pSVar1;
  }
  return (Pseudo *)pSVar1;
}

Assistant:

static Pseudo *allocate_symbol_pseudo(Proc *proc, LuaSymbol *sym, unsigned reg)
{
	C_MemoryAllocator *allocator = proc->linearizer->compiler_state->allocator;
	Pseudo *pseudo = (Pseudo *) allocator->calloc(allocator->arena, 1, sizeof(Pseudo));
	pseudo->type = PSEUDO_SYMBOL;
	pseudo->symbol = sym;
	pseudo->regnum = reg;
	if (sym->symbol_type == SYM_LOCAL) {
		assert(sym->variable.pseudo == NULL);
		sym->variable.pseudo = pseudo;
	}
	return pseudo;
}